

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O1

void __thiscall libDAI::NDP::NDP(NDP *this,FactorGraph *fg,Properties *opts,size_t k)

{
  pointer pvVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  Exception *this_00;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  string local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_40;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_38;
  
  DAIAlg<libDAI::FactorGraph>::DAIAlg(&this->super_DAIAlgFG,fg,opts);
  (this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm =
       (_func_int **)&PTR_clone_005e89c0;
  (this->Props).verbose = 0;
  this->_m_induced_width = 0;
  iVar2 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[5])(fg);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->_m_varOrder,CONCAT44(extraout_var,iVar2),(allocator_type *)&local_60);
  this->_m_deadlineInSeconds = 0.0;
  iVar2 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[5])(fg);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            (&this->_m_newFacs,CONCAT44(extraout_var_00,iVar2),(allocator_type *)&local_60);
  iVar2 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[5])(fg);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&this->_m_bestResps,CONCAT44(extraout_var_01,iVar2),(allocator_type *)&local_60);
  iVar2 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[5])(fg);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&this->_m_neighV,CONCAT44(extraout_var_02,iVar2),(allocator_type *)&local_60);
  iVar2 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[9])(fg);
  iVar3 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[5])(fg);
  local_38 = &this->_m_neighF;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(local_38,CONCAT44(extraout_var_04,iVar3) + CONCAT44(extraout_var_03,iVar2),
           (allocator_type *)&local_60);
  this->_g = fg;
  iVar2 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[5])(fg);
  local_40 = &this->_m_bestConfiguration;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (local_40,CONCAT44(extraout_var_05,iVar2),(allocator_type *)&local_60);
  this->_k = k;
  (this->_valConfs).
  super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_valConfs;
  (this->_valConfs).
  super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_valConfs;
  (this->_valConfs).
  super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this->_k_th_Val = -1.79769313486232e+308;
  iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0x11])(this);
  if ((char)iVar2 == '\0') {
    this_00 = (Exception *)__cxa_allocate_exception(0x10);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"ndp.cpp, line 108","");
    Exception::Exception(this_00,8,&local_60);
    __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar6 = 0;
  uVar5 = 0;
  while( true ) {
    iVar2 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[5])(fg);
    if (CONCAT44(extraout_var_06,iVar2) <= uVar5) {
      lVar6 = 0;
      uVar5 = 0;
      while( true ) {
        iVar2 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[9])(fg);
        if (CONCAT44(extraout_var_07,iVar2) <= uVar5) {
          return;
        }
        pvVar1 = (this->_m_neighF).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar4 = ((long)(this->_m_neighF).
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
                -0x5555555555555555;
        if (uVar4 < uVar5 || uVar4 - uVar5 == 0) break;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   ((long)&(pvVar1->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start + lVar6),
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   ((long)&(((fg->_fg)._nb2.
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start + lVar6));
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0x18;
      }
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5);
    }
    pvVar1 = (this->_m_neighV).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->_m_neighV).
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
            -0x5555555555555555;
    if (uVar4 < uVar5 || uVar4 - uVar5 == 0) break;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start + lVar6),
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(((fg->_fg)._nb1.
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar6));
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x18;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5);
}

Assistant:

NDP::NDP(const FactorGraph & fg, const Properties &opts, size_t k ) 
        : 
            DAIAlgFG(fg, opts),
            Props(),
            //_maxdiff(0.0),
            //_iterations(0UL),
            //_indices(),
            //_messages(),
            //_newmessages(),
            _m_induced_width(0),
            _m_varOrder( fg.nrVars() ),
            _m_deadlineInSeconds(0),
            _m_newFacs(  fg.nrVars() ),
            _m_bestResps(fg.nrVars() ),
            _m_neighV(   fg.nrVars() ),
            //original factors + the ones that will be introduced.
            _m_neighF(   fg.nrFactors() + fg.nrVars() ),
            _g(&fg) ,
            _m_bestConfiguration( fg.nrVars() ),
            _k(k),
            _k_th_Val(-DBL_MAX)//,
            //writeAnyTimeResults(false),
            //results_f(NULL),
            //timings_f(NULL)
    {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        for(size_t i=0; i < fg.nrVars() ; i++)
            //initialize neighborhoods from original model
            _m_neighV.at(i) = fg.nbV(i);
        
        for(size_t i=0; i < fg.nrFactors() ; i++)
            //initialize neighborhoods from original model
            _m_neighF.at(i) = fg.nbF(i);
            //the neighborhoods for the 'new' factors remain uninitialized.

/*        
        // clear messages
        _messages.clear();
        _messages.reserve(grm().nrEdges());

        // clear indices
        _indices.clear();
        _indices.reserve(grm().nrEdges());

        // create messages and indices
        for( size_t iI = 0; iI < grm().nrEdges(); iI++ ) {
            size_t i = grm().edge(iI).first;
            size_t I = grm().edge(iI).second;

            _messages.push_back( Prob( grm().var(i).states() ) );

            vector<size_t> ind( grm().factor(I).stateSpace(), 0 );
            Index indi (grm().var(i), grm().factor(I).vars() );
            for( size_t j = 0; indi >= 0; ++indi,++j )
                ind[j] = indi; 
            _indices.push_back( ind );
        }

        // create new_messages
        _newmessages = _messages;
*/        
    }